

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O2

string * ApprovalTests::FileNameSanitizerFactory::defaultSanitizer
                   (string *__return_storage_ptr__,string *fileName)

{
  char c;
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  stringstream result;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar1 = (fileName->_M_dataplus)._M_p;
  sVar2 = fileName->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    c = pcVar1[sVar4];
    bVar3 = isForbidden(c);
    if (bVar3) {
      ::std::operator<<(local_1a8,"_");
    }
    else {
      ::std::operator<<(local_1a8,c);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FileNameSanitizerFactory::defaultSanitizer(std::string fileName)
    {
        std::stringstream result;
        for (auto ch : fileName)
        {
            if (!isForbidden(ch))
            {
                result << ch;
            }
            else
            {
                result << "_";
            }
        }
        return result.str();
    }